

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdemux.cc
# Opt level: O2

bool libwebm::vttdemux::WriteCueIdentifier(FILE *f,FrameParser *parser)

{
  int iVar1;
  bool bVar2;
  string line;
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  iVar1 = libwebvtt::LineReader::GetLine(&parser->super_LineReader,&line);
  if (iVar1 == 0) {
    if (line._M_string_length == 0) {
LAB_0010f01e:
      bVar2 = true;
      goto LAB_0010f020;
    }
    iVar1 = fputs(line._M_dataplus._M_p,(FILE *)f);
    if (-1 < iVar1) {
      iVar1 = fputc(10,(FILE *)f);
      if (-1 < iVar1) goto LAB_0010f01e;
    }
  }
  bVar2 = false;
LAB_0010f020:
  std::__cxx11::string::~string((string *)&line);
  return bVar2;
}

Assistant:

bool vttdemux::WriteCueIdentifier(FILE* f, FrameParser* parser) {
  string line;
  int e = parser->GetLine(&line);

  if (e)  // error or EOS
    return false;

  // If the cue identifier line is empty, this means that the original
  // WebVTT cue did not have a cue identifier, so we don't bother
  // writing an extra line terminator to the output file (though doing
  // so would be harmless).

  if (!line.empty()) {
    if (fputs(line.c_str(), f) < 0)
      return false;

    if (fputc('\n', f) < 0)
      return false;
  }

  return true;
}